

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

uint32 re2::Prog::EmptyFlags(StringPiece *text,char *p)

{
  bool bVar1;
  bool bVar2;
  iterator pcVar3;
  uint local_1c;
  int flags;
  char *p_local;
  StringPiece *text_local;
  
  pcVar3 = StringPiece::begin(text);
  if (p == pcVar3) {
    local_1c = 5;
  }
  else {
    local_1c = (uint)(p[-1] == '\n');
  }
  pcVar3 = StringPiece::end(text);
  if (p == pcVar3) {
    local_1c = local_1c | 10;
  }
  else {
    pcVar3 = StringPiece::end(text);
    if ((p < pcVar3) && (*p == '\n')) {
      local_1c = local_1c | 2;
    }
  }
  pcVar3 = StringPiece::begin(text);
  if ((p != pcVar3) || (pcVar3 = StringPiece::end(text), p != pcVar3)) {
    pcVar3 = StringPiece::begin(text);
    if (p == pcVar3) {
      bVar1 = IsWordChar(*p);
      if (bVar1) {
        local_1c = local_1c | 0x10;
      }
    }
    else {
      pcVar3 = StringPiece::end(text);
      if (p == pcVar3) {
        bVar1 = IsWordChar(p[-1]);
        if (bVar1) {
          local_1c = local_1c | 0x10;
        }
      }
      else {
        bVar1 = IsWordChar(p[-1]);
        bVar2 = IsWordChar(*p);
        if (bVar1 != bVar2) {
          local_1c = local_1c | 0x10;
        }
      }
    }
  }
  if ((local_1c & 0x10) == 0) {
    local_1c = local_1c | 0x20;
  }
  return local_1c;
}

Assistant:

uint32 Prog::EmptyFlags(const StringPiece& text, const char* p) {
  int flags = 0;

  // ^ and \A
  if (p == text.begin())
    flags |= kEmptyBeginText | kEmptyBeginLine;
  else if (p[-1] == '\n')
    flags |= kEmptyBeginLine;

  // $ and \z
  if (p == text.end())
    flags |= kEmptyEndText | kEmptyEndLine;
  else if (p < text.end() && p[0] == '\n')
    flags |= kEmptyEndLine;

  // \b and \B
  if (p == text.begin() && p == text.end()) {
    // no word boundary here
  } else if (p == text.begin()) {
    if (IsWordChar(p[0]))
      flags |= kEmptyWordBoundary;
  } else if (p == text.end()) {
    if (IsWordChar(p[-1]))
      flags |= kEmptyWordBoundary;
  } else {
    if (IsWordChar(p[-1]) != IsWordChar(p[0]))
      flags |= kEmptyWordBoundary;
  }
  if (!(flags & kEmptyWordBoundary))
    flags |= kEmptyNonWordBoundary;

  return flags;
}